

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

void libxml_xmlRelaxNGValidityWarningFunc(void *ctx,char *msg,...)

{
  long lVar1;
  char in_AL;
  char *str;
  long *plVar2;
  PyObject *pPVar3;
  long *plVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_e8.gp_offset = 0x10;
  local_e8.fp_offset = 0x30;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  str = libxml_buildMessage(msg,&local_e8);
  plVar2 = (long *)PyTuple_New(2);
  pPVar3 = libxml_charPtrWrap(str);
  PyTuple_SetItem(plVar2,0,pPVar3);
  PyTuple_SetItem(plVar2,1,*(undefined8 *)((long)ctx + 0x10));
  plVar4 = *(long **)((long)ctx + 0x10);
  if (plVar4 != (long *)0x0) {
    *plVar4 = *plVar4 + 1;
  }
  plVar4 = (long *)PyEval_CallObjectWithKeywords(*ctx,plVar2,0);
  if (plVar4 == (long *)0x0) {
    PyErr_Print();
    if (plVar2 == (long *)0x0) {
      return;
    }
    *plVar2 = *plVar2 + -1;
    lVar1 = *plVar2;
    plVar4 = plVar2;
  }
  else {
    if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
      _Py_Dealloc(plVar2);
    }
    *plVar4 = *plVar4 + -1;
    lVar1 = *plVar4;
  }
  if (lVar1 == 0) {
    _Py_Dealloc(plVar4);
  }
  return;
}

Assistant:

static void
libxml_xmlRelaxNGValidityWarningFunc(void *ctx, const char *msg, ...)
{
    va_list ap;

    va_start(ap, msg);
    libxml_xmlRelaxNGValidityGenericWarningFuncHandler(ctx, libxml_buildMessage(msg, ap));
    va_end(ap);
}